

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_OBSOLETE_V5_DimAngular::Dim3dPoint
          (ON_3dPoint *__return_storage_ptr__,ON_OBSOLETE_V5_DimAngular *this,int point_index)

{
  ON_2dPoint OVar1;
  double local_28;
  ON_2dPoint p2;
  int point_index_local;
  ON_OBSOLETE_V5_DimAngular *this_local;
  
  OVar1 = Dim2dPoint(this,point_index);
  local_28 = OVar1.x;
  if ((local_28 != -1.23432101234321e+308) || (NAN(local_28))) {
    p2.x = OVar1.y;
    ON_Plane::PointAt(__return_storage_ptr__,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,
                      local_28,p2.x);
  }
  else {
    __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
    __return_storage_ptr__->y = ON_3dPoint::UnsetPoint.y;
    __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_OBSOLETE_V5_DimAngular::Dim3dPoint( int point_index ) const
{
  ON_2dPoint p2 = Dim2dPoint(point_index);
  if (ON_UNSET_VALUE == p2.x)
    return ON_3dPoint::UnsetPoint;

  ON_3dPoint p = m_plane.PointAt(p2.x, p2.y);
  return p;

  //return (ON_UNSET_VALUE == p2.x) ? ON_3dPoint::UnsetPoint : m_plane.PointAt(p2.x,p2.y);
}